

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cowsay.cpp
# Opt level: O1

void __thiscall Cow_message_integrity::test_method(Cow_message_integrity *this)

{
  MockingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pMVar1;
  MockingContext<unsigned_long> *pMVar2;
  long lVar3;
  StubbingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rootWithoutConst;
  Xaction *pXVar4;
  MethodProgress<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  progress;
  shared_ptr<IMessageHolder> message;
  string said;
  Cow cow;
  Mock<IMessageHolder> mockHolder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  MethodStubbingProgress<unsigned_long> local_268;
  smart_ptr<fakeit::WhenFunctor::StubbingChange> local_260;
  Xaction *local_250;
  shared_ptr<IMessageHolder> local_248;
  IMessageHolder *local_238;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_230;
  undefined1 local_228 [56];
  Cow local_1f0;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  Mock<IMessageHolder> local_d8;
  
  fakeit::Mock<IMessageHolder>::Mock(&local_d8);
  fakeit::MockImpl<IMessageHolder>::stubMethod<1,std::__cxx11::string,IMessageHolder,,void>
            ((MockingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_228,&local_d8.impl,1);
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"mockHolder","");
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"GetMessage","");
  pMVar1 = fakeit::
           MockingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::setMethodDetails((MockingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_228,&local_188,&local_1a8);
  pXVar4 = (Xaction *)
           ((pMVar1->
            super_MethodMockingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).super_Sequence._vptr_Sequence[-3] +
           (long)&(pMVar1->
                  super_MethodMockingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).super_Sequence._vptr_Sequence);
  local_268._vptr_MethodStubbingProgress = (_func_int **)&PTR__MethodProgress_0012c0e8;
  local_260.pData = (StubbingChange *)operator_new(0x10);
  (local_260.pData)->_vptr_StubbingChange = (_func_int **)&PTR__StubbingChange_0012f638;
  (local_260.pData)->_xaction = pXVar4;
  local_260.reference = (RefCount *)0x0;
  local_260.reference = (RefCount *)operator_new(4);
  (local_260.reference)->count = 0;
  (local_260.reference)->count = 1;
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  local_250 = pXVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"moo","");
  fakeit::MethodStubbingProgress<std::__cxx11::string>::AlwaysReturn<std::__cxx11::string>
            ((MethodStubbingProgress<std::__cxx11::string> *)&local_268,&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  local_268._vptr_MethodStubbingProgress = (_func_int **)&PTR__MethodProgress_0012c0e8;
  fakeit::smart_ptr<fakeit::WhenFunctor::StubbingChange>::~smart_ptr(&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  fakeit::
  MethodMockingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~MethodMockingContext
            ((MethodMockingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_228,&PTR_construction_vtable_32__0012c338);
  fakeit::MockImpl<IMessageHolder>::stubMethod<2,unsigned_long,IMessageHolder,,void>
            ((MockingContext<unsigned_long> *)local_228,&local_d8.impl,9);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"mockHolder","");
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"GetLength","");
  pMVar2 = fakeit::MockingContext<unsigned_long>::setMethodDetails
                     ((MockingContext<unsigned_long> *)local_228,&local_1c8,&local_1e8);
  pXVar4 = (Xaction *)
           ((pMVar2->super_MethodMockingContext<unsigned_long>).super_Sequence._vptr_Sequence[-3] +
           (long)&(pMVar2->super_MethodMockingContext<unsigned_long>).super_Sequence._vptr_Sequence)
  ;
  local_268._vptr_MethodStubbingProgress = (_func_int **)&PTR__MethodProgress_0012c780;
  local_260.pData = (StubbingChange *)operator_new(0x10);
  (local_260.pData)->_vptr_StubbingChange = (_func_int **)&PTR__StubbingChange_0012f638;
  (local_260.pData)->_xaction = pXVar4;
  local_260.reference = (RefCount *)0x0;
  local_260.reference = (RefCount *)operator_new(4);
  (local_260.reference)->count = 0;
  (local_260.reference)->count = 1;
  local_288._M_dataplus._M_p = (pointer)0x3;
  local_250 = pXVar4;
  fakeit::MethodStubbingProgress<unsigned_long>::AlwaysReturn<unsigned_long>
            (&local_268,(unsigned_long *)&local_288);
  local_268._vptr_MethodStubbingProgress = (_func_int **)&PTR__MethodProgress_0012c780;
  fakeit::smart_ptr<fakeit::WhenFunctor::StubbingChange>::~smart_ptr(&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  fakeit::MethodMockingContext<unsigned_long>::~MethodMockingContext
            ((MethodMockingContext<unsigned_long> *)local_228,&PTR_construction_vtable_32__0012c9c0)
  ;
  local_238 = local_d8.impl._proxy.instance;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IMessageHolder*,void(*)(IMessageHolder*),std::allocator<void>,void>
            (&local_230,local_d8.impl._proxy.instance,TestHelper::blank<IMessageHolder>);
  local_1f0 = (Cow)&PTR_Say_abi_cxx11__0012fd50;
  local_248.super___shared_ptr<IMessageHolder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_238;
  local_248.super___shared_ptr<IMessageHolder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_230._M_pi;
  if (local_230._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_230._M_pi)->_M_use_count = (local_230._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_230._M_pi)->_M_use_count = (local_230._M_pi)->_M_use_count + 1;
    }
  }
  Cow::Say_abi_cxx11_((string *)local_228,&local_1f0,&local_248);
  if (local_248.super___shared_ptr<IMessageHolder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<IMessageHolder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/MatrixManAtYrService[P]hello-cpp-linwin/test/cowsay.cpp"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0x28);
  lVar3 = std::__cxx11::string::find(local_228,0x11c12e,0);
  local_288._M_string_length = 0;
  local_288.field_2._M_allocated_capacity = 0;
  local_260.pData = (StubbingChange *)((ulong)local_260.pData & 0xffffffffffffff00);
  local_268._vptr_MethodStubbingProgress = (_func_int **)&PTR__lazy_ostream_0012fba0;
  local_260.reference = (RefCount *)&boost::unit_test::lazy_ostream::inst;
  local_250 = (Xaction *)0x11c0f9;
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/MatrixManAtYrService[P]hello-cpp-linwin/test/cowsay.cpp"
  ;
  local_100 = "";
  local_288._M_dataplus._M_p._0_1_ = lVar3 != -1;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_288.field_2._M_allocated_capacity);
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/MatrixManAtYrService[P]hello-cpp-linwin/test/cowsay.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0x29);
  lVar3 = std::__cxx11::string::find(local_228,0x11c132,0);
  local_288._M_dataplus._M_p._0_1_ = lVar3 != -1;
  local_288._M_string_length = 0;
  local_288.field_2._M_allocated_capacity = 0;
  local_260.pData = (StubbingChange *)((ulong)local_260.pData & 0xffffffffffffff00);
  local_268._vptr_MethodStubbingProgress = (_func_int **)&PTR__lazy_ostream_0012fbe0;
  local_260.reference = (RefCount *)&boost::unit_test::lazy_ostream::inst;
  local_250 = (Xaction *)0x11c134;
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/MatrixManAtYrService[P]hello-cpp-linwin/test/cowsay.cpp"
  ;
  local_130 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_288.field_2._M_allocated_capacity);
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/MatrixManAtYrService[P]hello-cpp-linwin/test/cowsay.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0x2a);
  lVar3 = std::__cxx11::string::find(local_228,0x11df61,0);
  local_288._M_dataplus._M_p._0_1_ = lVar3 != -1;
  local_288._M_string_length = 0;
  local_288.field_2._M_allocated_capacity = 0;
  local_260.pData = (StubbingChange *)((ulong)local_260.pData & 0xffffffffffffff00);
  local_268._vptr_MethodStubbingProgress = (_func_int **)&PTR__lazy_ostream_0012fbe0;
  local_260.reference = (RefCount *)&boost::unit_test::lazy_ostream::inst;
  local_250 = (Xaction *)0x11c153;
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/MatrixManAtYrService[P]hello-cpp-linwin/test/cowsay.cpp"
  ;
  local_160 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_288.field_2._M_allocated_capacity);
  if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
    operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
  }
  if (local_230._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_230._M_pi);
  }
  local_d8.super_ActualInvocationsSource._vptr_ActualInvocationsSource =
       (_func_int **)&PTR_getActualInvocations_0012cd48;
  fakeit::MockImpl<IMessageHolder>::~MockImpl(&local_d8.impl,&fakeit::MockImpl<IMessageHolder>::VTT)
  ;
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(Cow_message_integrity)
{
    // mock any dependencies that aren't internal to this library
    Mock<IMessageHolder> mockHolder;
    When(Method(mockHolder, GetMessage)).AlwaysReturn("moo");
    When(Method(mockHolder, GetLength)).AlwaysReturn(3);

    auto message = TestHelper::PointToMocked<IMessageHolder>(&mockHolder.get());

    Cow cow;
    auto said = cow.Say(message);

/*
  v---- checking for this

(moo)

    \   ^__^          v----- and this
     \  (oo)\_______
        (__)\       )\/\
            ||----w |
            ||     ||

                  ^--- and this
*/

    BOOST_CHECK_MESSAGE(said.find("moo") != string::npos, "If the message was moo then the cow should have said moo");
    BOOST_CHECK_MESSAGE(said.find("w") != string::npos, "The cow should have had utters");
    BOOST_CHECK_MESSAGE(said.find("\\/\\") != string::npos, "The cow should have had a tail");
}